

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::Decode(BoundingSphereRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
    KDataStream::Read<unsigned_short>(stream,&(this->super_EnvironmentRecord).m_ui16Length);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Index);
    KDataStream::Read(stream,&(this->super_EnvironmentRecord).m_ui8Padding);
    (*(this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_CentLocation,stream)
    ;
    KDataStream::Read<float>(stream,(float *)&this->m_f32Rad);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void BoundingSphereRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < BOUNDING_SPHERE_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CentLocation
           >> m_f32Rad
           >> m_ui32Padding;
}